

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O3

IceTImage icetVtreeCompose(void)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  IceTImage image;
  bool bVar8;
  uint uVar9;
  int iVar10;
  node_info *info;
  IceTBoolean *pIVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  long lVar19;
  node_info *pnVar20;
  int iVar21;
  int iVar22;
  IceTInt num_tiles_00;
  node_info *pnVar23;
  node_info *pnVar24;
  IceTInt num_tiles;
  IceTInt num_proc;
  IceTBoolean *local_c0;
  IceTInt rank;
  IceTImage local_b0;
  IceTInt *local_a8;
  uint local_a0;
  IceTInt tile_displayed;
  IceTSparseImage local_98;
  IceTVoid *local_90;
  ulong local_88;
  int local_7c;
  IceTInt *local_78;
  int *local_70;
  int *local_68;
  IceTInt max_height;
  IceTInt max_width;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  icetGetIntegerv(2,&rank);
  icetGetIntegerv(3,&num_proc);
  icetGetIntegerv(0x10,&num_tiles);
  icetGetIntegerv(0x13,&max_width);
  icetGetIntegerv(0x14,&max_height);
  local_a8 = icetUnsafeStateGetInteger(0x1a);
  local_78 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x1b,&tile_displayed);
  uVar9 = icetSparseImageBufferSize(max_width,max_height);
  local_b0 = icetGetStateBufferImage(0x1a0,max_width,max_height);
  local_88 = (ulong)uVar9;
  local_90 = icetGetStateBuffer(0x1a1,uVar9);
  local_98 = icetGetStateBufferSparseImage(0x1a2,max_width,max_height);
  info = (node_info *)icetGetStateBuffer(0x1a3,num_proc * 0x1c);
  pIVar11 = (IceTBoolean *)icetGetStateBuffer(0x1a4,num_tiles * num_proc);
  icetGetBooleanv(0x89,pIVar11);
  uVar12 = (ulong)(uint)num_proc;
  if (0 < num_proc) {
    lVar15 = 0;
    do {
      info[lVar15].rank = (int)lVar15;
      info[lVar15].num_contained = 0;
      info[lVar15].tile_held = -1;
      if (0 < num_tiles) {
        lVar19 = 0;
        iVar21 = 0;
        do {
          if (pIVar11[lVar19 + (int)lVar15 * num_tiles] != '\0') {
            iVar21 = iVar21 + 1;
            info[lVar15].num_contained = iVar21;
          }
          lVar19 = lVar19 + 1;
        } while ((int)lVar19 < num_tiles);
      }
      lVar15 = lVar15 + 1;
      uVar12 = (ulong)num_proc;
    } while (lVar15 < (long)uVar12);
  }
  local_68 = &info->tile_receiving;
  local_70 = &info[1].recv_src;
  uVar9 = 0xffffffff;
  local_c0 = pIVar11;
  while( true ) {
    iVar21 = (int)uVar12;
    if (1 < iVar21) {
      uVar12 = 0;
      bVar8 = false;
      do {
        do {
          bVar5 = bVar8;
          if (info[uVar12 + 1].num_contained < info[uVar12].num_contained) {
            pnVar23 = info + uVar12;
            pnVar20 = info + uVar12 + 1;
            uStack_58._0_4_ = pnVar23->rank;
            uStack_58._4_4_ = pnVar23->num_contained;
            uVar2 = pnVar23->tile_held;
            uVar3 = pnVar23->tile_sending;
            uVar4 = pnVar23->tile_receiving;
            uStack_44._0_4_ = pnVar23->send_dest;
            uStack_44._4_4_ = pnVar23->recv_src;
            iVar1 = pnVar20->rank;
            iVar22 = pnVar20->num_contained;
            iVar6 = info[uVar12 + 1].tile_held;
            iVar7 = info[uVar12 + 1].tile_sending;
            iVar17 = info[uVar12 + 1].tile_receiving;
            iVar14 = info[uVar12 + 1].send_dest;
            iVar10 = info[uVar12 + 1].recv_src;
            pnVar23->tile_sending = info[uVar12 + 1].tile_sending;
            pnVar23->tile_receiving = iVar17;
            pnVar23->send_dest = iVar14;
            pnVar23->recv_src = iVar10;
            pnVar23->rank = iVar1;
            pnVar23->num_contained = iVar22;
            pnVar23->tile_held = iVar6;
            pnVar23->tile_sending = iVar7;
            info[uVar12 + 1].tile_sending = uVar3;
            info[uVar12 + 1].tile_receiving = uVar4;
            info[uVar12 + 1].send_dest = (undefined4)uStack_44;
            info[uVar12 + 1].recv_src = uStack_44._4_4_;
            pnVar20->rank = (undefined4)uStack_58;
            pnVar20->num_contained = uStack_58._4_4_;
            info[uVar12 + 1].tile_held = uVar2;
            info[uVar12 + 1].tile_sending = uVar3;
            bVar5 = true;
            uStack_50 = uVar2;
            local_4c = uVar3;
            uStack_48 = uVar4;
          }
          uVar12 = uVar12 + 1;
          bVar8 = bVar5;
        } while (uVar12 != iVar21 - 1);
        uVar12 = 0;
        bVar8 = false;
      } while (bVar5);
    }
    if (iVar21 < 1) break;
    lVar15 = 0;
    piVar13 = local_68;
    do {
      *(undefined8 *)(piVar13 + -1) = 0xffffffffffffffff;
      lVar15 = lVar15 + 1;
      uVar12 = (ulong)num_proc;
      piVar13 = piVar13 + 7;
    } while (lVar15 < (long)uVar12);
    if (num_proc < 1) break;
    lVar15 = 0;
    iVar17 = -1;
    iVar21 = 0;
    piVar13 = local_70;
    pIVar11 = local_c0;
    local_a0 = uVar9;
    do {
      iVar14 = iVar21;
      if (info[lVar15].tile_receiving < 0) {
        pnVar23 = info + lVar15;
        iVar14 = pnVar23->tile_held;
        if ((long)iVar14 < 0) {
LAB_0011775f:
          iVar14 = iVar21;
          if (0 < num_tiles) {
            uVar12 = 0;
            num_tiles_00 = num_tiles;
            local_7c = iVar21;
            do {
              if ((((pIVar11[uVar12 + (long)(pnVar23->rank * num_tiles_00)] != '\0') ||
                   (local_a8[uVar12] == pnVar23->rank)) && (uVar12 != (uint)pnVar23->tile_sending))
                 && (iVar21 = find_sender(info,num_proc,(int)lVar15,(int)uVar12,local_a8[uVar12],
                                          num_tiles_00,pIVar11), pIVar11 = local_c0,
                    num_tiles_00 = num_tiles, iVar21 != 0)) {
                iVar14 = 1;
                break;
              }
              uVar12 = uVar12 + 1;
              iVar14 = local_7c;
            } while ((long)uVar12 < (long)num_tiles_00);
          }
          goto LAB_00117658;
        }
        iVar10 = find_sender(info,(int)uVar12,(int)lVar15,iVar14,local_a8[iVar14],num_tiles,pIVar11)
        ;
        pIVar11 = local_c0;
        iVar14 = 1;
        if ((iVar10 != 0) || (iVar14 = iVar21, -1 < pnVar23->tile_sending)) goto LAB_00117658;
        iVar10 = pnVar23->rank;
        iVar1 = pnVar23->tile_held;
        if (iVar10 == local_a8[iVar1]) goto LAB_00117658;
        uVar12 = (ulong)num_proc;
        if (lVar15 + 1 < (long)uVar12) {
          iVar22 = num_proc + iVar17;
          piVar18 = piVar13;
          do {
            if (((piVar18[-2] < 0) && ((piVar18[-4] < 0 || (piVar18[-4] == iVar1)))) &&
               ((iVar14 = ((node_info *)(piVar18 + -6))->rank, iVar14 == local_a8[iVar1] ||
                (local_c0[iVar14 * num_tiles + iVar1] != '\0')))) {
              piVar18[-4] = iVar1;
              piVar18[-2] = iVar1;
              *piVar18 = iVar10;
              pnVar23->tile_sending = iVar1;
              pnVar23->send_dest = iVar14;
              if (pnVar23->tile_held == iVar1) {
                pnVar23->tile_held = -1;
              }
              pnVar23->num_contained = pnVar23->num_contained + -1;
              local_c0[iVar10 * num_tiles + iVar1] = '\0';
              iVar21 = 1;
              goto LAB_0011775f;
            }
            piVar18 = piVar18 + 7;
            iVar22 = iVar22 + -1;
            iVar14 = iVar21;
          } while (iVar22 != 0);
          goto LAB_00117658;
        }
      }
      else {
LAB_00117658:
        uVar12 = (ulong)(uint)num_proc;
        iVar21 = iVar14;
      }
      lVar15 = lVar15 + 1;
      iVar17 = iVar17 + -1;
      piVar13 = piVar13 + 7;
    } while (lVar15 < (int)uVar12);
    if ((int)uVar12 < 1) {
      pnVar23 = (node_info *)0x0;
    }
    else {
      uVar12 = uVar12 & 0xffffffff;
      pnVar23 = info;
      do {
        if (pnVar23->rank == rank) goto LAB_0011781b;
        pnVar23 = pnVar23 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      pnVar23 = (node_info *)0x0;
    }
LAB_0011781b:
    do_send_receive(pnVar23,local_a0,num_tiles,pIVar11,local_b0,local_90,(IceTSizeType)local_88,
                    local_98);
    uVar9 = pnVar23->tile_held;
    if (iVar21 == 0) goto LAB_00117887;
    uVar12 = (ulong)(uint)num_proc;
  }
  pnVar23 = (node_info *)0x0;
  do_send_receive((node_info *)0x0,uVar9,num_tiles,local_c0,local_b0,local_90,(IceTSizeType)local_88
                  ,local_98);
  uVar9 = _DAT_00000008;
LAB_00117887:
  lVar19 = (long)num_proc;
  lVar15 = lVar19;
  pnVar20 = info;
  uVar16 = uVar9;
  if (0 < lVar19) {
    do {
      pnVar24 = pnVar20;
      if (pnVar20->rank == rank) break;
      lVar15 = lVar15 + -1;
      pnVar20 = pnVar20 + 1;
      pnVar24 = pnVar23;
    } while (lVar15 != 0);
    pnVar23 = pnVar24;
    uVar16 = pnVar24->tile_held;
  }
  pnVar23->tile_sending = -1;
  pnVar23->tile_receiving = -1;
  if (uVar16 != tile_displayed && -1 < (int)uVar16) {
    pnVar23->tile_sending = uVar16;
    pnVar23->send_dest = local_a8[uVar16];
    pnVar23->tile_held = -1;
    uVar16 = 0xffffffff;
  }
  if ((-1 < tile_displayed && 0 < num_proc) && uVar16 != tile_displayed) {
    lVar15 = 0;
    do {
      if (*(int *)((long)&info->tile_held + lVar15) == tile_displayed) {
        pnVar23->tile_receiving = tile_displayed;
        pnVar23->recv_src = *(int *)((long)&info->rank + lVar15);
        pnVar23->tile_held = tile_displayed;
        break;
      }
      lVar15 = lVar15 + 0x1c;
    } while (lVar19 * 0x1c != lVar15);
  }
  do_send_receive(pnVar23,uVar9,num_tiles,local_c0,local_b0,local_90,(IceTSizeType)local_88,local_98
                 );
  image.opaque_internals = local_b0.opaque_internals;
  if ((-1 < tile_displayed) && (tile_displayed != pnVar23->tile_held)) {
    if (local_c0[num_tiles * rank + tile_displayed] == '\0') {
      icetImageSetDimensions
                (local_b0,local_78[(ulong)(uint)(tile_displayed << 2) + 2],
                 local_78[(ulong)(uint)(tile_displayed << 2) + 3]);
      icetClearImage(image);
    }
    else {
      icetGetTileImage(tile_displayed,local_b0);
    }
  }
  return (IceTImage)local_b0.opaque_internals;
}

Assistant:

IceTImage icetVtreeCompose(void)
{
    IceTInt rank, num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *display_nodes;
    IceTInt tile_displayed;
    IceTBoolean *all_contained_tmasks;
    const IceTInt *tile_viewports;
    IceTImage image;
    IceTVoid *inSparseImageBuffer;
    IceTSparseImage outSparseImage;
    IceTSizeType sparseImageSize;
    struct node_info *info;
    struct node_info *my_info;
    int tile, node;
    int tiles_transfered;
    int tile_held = -1;

    icetRaiseDebug("In vtreeCompose");

  /* Get state. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

  /* Allocate buffers. */
    sparseImageSize = icetSparseImageBufferSize(max_width, max_height);

    image                = icetGetStateBufferImage(VTREE_IMAGE_BUFFER,
                                                   max_width, max_height);
    inSparseImageBuffer  = icetGetStateBuffer(VTREE_IN_SPARSE_IMAGE_BUFFER,
                                              sparseImageSize);
    outSparseImage       = icetGetStateBufferSparseImage(
                                                  VTREE_OUT_SPARSE_IMAGE_BUFFER,
                                                  max_width, max_height);
    info                 = icetGetStateBuffer(VTREE_INFO_BUFFER,
                                             sizeof(struct node_info)*num_proc);
    all_contained_tmasks = icetGetStateBuffer(VTREE_ALL_CONTAINED_TMASKS_BUFFER,
                                        sizeof(IceTBoolean)*num_proc*num_tiles);

    icetGetBooleanv(ICET_ALL_CONTAINED_TILES_MASKS, all_contained_tmasks);
    
  /* Initialize info array. */
    for (node = 0; node < num_proc; node++) {
        info[node].rank = node;
        info[node].tile_held = -1;        /* Id of tile image held in memory. */
        info[node].num_contained = 0;        /* # of images to be rendered. */
        for (tile = 0; tile < num_tiles; tile++) {
            if (all_contained_tmasks[node*num_tiles + tile]) {
                info[node].num_contained++;
            }
        }
    }

#define CONTAINS_TILE(nodei, tile)                                \
    (all_contained_tmasks[info[nodei].rank*num_tiles+(tile)])

    tile_held = -1;
    do {
        int recv_node;

        tiles_transfered = 0;
        sort_by_contained(info, num_proc);
        for (node = 0; node < num_proc; node++) {
            info[node].tile_sending = -1;
            info[node].tile_receiving = -1;
        }

        for (recv_node = 0; recv_node < num_proc; recv_node++) {
            struct node_info *recv_info = info + recv_node;

            if (recv_info->tile_receiving >= 0) continue;

            if (recv_info->tile_held >= 0) {
              /* This node is holding a tile.  It must either send or
                 receive this tile. */
                if (find_sender(info, num_proc, recv_node, recv_info->tile_held,
                                display_nodes[recv_info->tile_held],
                                num_tiles, all_contained_tmasks)) {
                    tiles_transfered = 1;
                    continue;
                }

              /* Could not find a match for a sender, how about someone who
                 can receive it? */
                if (   (recv_info->tile_sending < 0)
                    && (recv_info->rank != display_nodes[recv_info->tile_held])
                    && find_receiver(info, num_proc, recv_node,
                                     recv_info->tile_held,
                                     display_nodes[recv_info->tile_held],
                                     num_tiles, all_contained_tmasks) ) {
                    tiles_transfered = 1;
                } else {
                  /* Could not send or receive.  Give up. */
                    continue;
                }
            }

          /* OK.  Let's try to receive any tile that we still have. */
            for (tile = 0; tile < num_tiles; tile++) {
                if (   (   !CONTAINS_TILE(recv_node, tile)
                        && (display_nodes[tile] != recv_info->rank) )
                    || (recv_info->tile_sending == tile) ) continue;
                if (find_sender(info, num_proc, recv_node, tile,
                                display_nodes[tile], num_tiles,
                                all_contained_tmasks)) {
                    tiles_transfered = 1;
                    break;
                }
            }
        }

      /* Now that we figured out who is sending to who, do the actual
         send and receive. */
        my_info = NULL;
        for (node = 0; node < num_proc; node++) {
            if (info[node].rank == rank) {
                my_info = info + node;
                break;
            }
        }

        do_send_receive(my_info, tile_held, num_tiles,
                        all_contained_tmasks,
                        image, inSparseImageBuffer, sparseImageSize,
                        outSparseImage);

        tile_held = my_info->tile_held;

    } while (tiles_transfered);

  /* It's possible that a composited image ended up on a processor that        */
  /* is not the display node for that image.  Do one last round of        */
  /* transfers to make sure all the tiles ended up in the right place.        */
    for (node = 0; node < num_proc; node++) {
        if (info[node].rank == rank) {
            my_info = info + node;
            break;
        }
    }
    my_info->tile_receiving = -1;
    my_info->tile_sending = -1;
    if ((my_info->tile_held >= 0) && (my_info->tile_held != tile_displayed)) {
      /* I'm holding an image that does not belong to me.  Ship it off. */
        my_info->tile_sending = my_info->tile_held;
        my_info->send_dest = display_nodes[my_info->tile_held];
        my_info->tile_held = -1;
    }
    if ((my_info->tile_held != tile_displayed) && (tile_displayed >= 0)) {
      /* Someone may be holding an image that belongs to me.  Check. */
        for (node = 0; node < num_proc; node++) {
            if (info[node].tile_held == tile_displayed) {
                my_info->tile_receiving = tile_displayed;
                my_info->recv_src = info[node].rank;
                my_info->tile_held = tile_displayed;
                break;
            }
        }
    }
    do_send_receive(my_info, tile_held,
                    num_tiles, all_contained_tmasks,
                    image, inSparseImageBuffer, sparseImageSize,
                    outSparseImage);
    tile_held = my_info->tile_held;

  /* Hacks for when "this" tile was not rendered. */
    if ((tile_displayed >= 0) && (tile_displayed != tile_held)) {
        if (all_contained_tmasks[rank*num_tiles + tile_displayed]) {
          /* Only "this" node draws "this" tile.  Because the image never */
          /* needed to be transferred, it was never rendered above.  Just */
          /* render it now.                                                  */
            icetRaiseDebug("Rendering tile to display.");
          /* This may uncessarily read a buffer if not outputing an input
             buffer */
            icetGetTileImage(tile_displayed, image);
        } else {
          /* "This" tile is blank. */
            const IceTInt *display_tile_viewport
                = tile_viewports + 4*tile_displayed;
            IceTInt display_tile_width = display_tile_viewport[2];
            IceTInt display_tile_height = display_tile_viewport[3];

            icetRaiseDebug("Returning blank image.");
            icetImageSetDimensions(
                                image, display_tile_width, display_tile_height);
            icetClearImage(image);
        }
    }

    return image;
}